

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.h
# Opt level: O0

void __thiscall nigel::Token_Identifier::Token_Identifier(Token_Identifier *this,String *identifier)

{
  String *identifier_local;
  Token_Identifier *this_local;
  
  Token::Token(&this->super_Token,identifier);
  (this->super_Token)._vptr_Token = (_func_int **)&PTR__Token_Identifier_002b6c88;
  std::__cxx11::string::string((string *)&this->identifier);
  std::__cxx11::string::operator=((string *)&this->identifier,(string *)identifier);
  return;
}

Assistant:

Token_Identifier( String identifier ) : Token( Type::identifier )
		{
			this->identifier = identifier;
		}